

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int copy_out(archive_write *a,uint64_t offset,uint64_t length)

{
  int *piVar1;
  __off_t _Var2;
  uint *puVar3;
  archive_write *a_00;
  ssize_t sVar4;
  ulong in_RDX;
  __off_t in_RSI;
  archive *in_RDI;
  uchar *wb;
  ssize_t rs;
  size_t rsize;
  int r;
  _7zip_conflict *zip;
  size_t local_38;
  ulong local_20;
  int local_4;
  
  piVar1 = *(int **)&in_RDI[1].current_codepage;
  local_20 = in_RDX;
  if ((*(long *)(piVar1 + 2) == 0) || (_Var2 = lseek(*piVar1,in_RSI,0), -1 < _Var2)) {
    do {
      if (local_20 == 0) {
        return 0;
      }
      if (*(ulong *)(piVar1 + 0x3c42) < local_20) {
        local_38 = *(size_t *)(piVar1 + 0x3c42);
      }
      else {
        local_38 = local_20;
      }
      a_00 = (archive_write *)((long)piVar1 + (0xf108 - *(long *)(piVar1 + 0x3c42)));
      sVar4 = read(*piVar1,a_00,local_38);
      if (sVar4 < 0) {
        puVar3 = (uint *)__errno_location();
        archive_set_error(in_RDI,(int)(ulong)*puVar3,"Can\'t read temporary file(%jd)",sVar4);
        return -0x1e;
      }
      if (sVar4 == 0) {
        archive_set_error(in_RDI,0,"Truncated 7-Zip archive");
        return -0x1e;
      }
      *(long *)(piVar1 + 0x3c42) = *(long *)(piVar1 + 0x3c42) - sVar4;
      local_20 = local_20 - sVar4;
    } while ((*(long *)(piVar1 + 0x3c42) != 0) || (local_4 = flush_wbuff(a_00), local_4 == 0));
  }
  else {
    puVar3 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar3,"lseek failed");
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
copy_out(struct archive_write *a, uint64_t offset, uint64_t length)
{
	struct _7zip *zip;
	int r;

	zip = (struct _7zip *)a->format_data;
	if (zip->temp_offset > 0 &&
	    lseek(zip->temp_fd, offset, SEEK_SET) < 0) {
		archive_set_error(&(a->archive), errno, "lseek failed");
		return (ARCHIVE_FATAL);
	}
	while (length) {
		size_t rsize;
		ssize_t rs;
		unsigned char *wb;

		if (length > zip->wbuff_remaining)
			rsize = zip->wbuff_remaining;
		else
			rsize = (size_t)length;
		wb = zip->wbuff + (sizeof(zip->wbuff) - zip->wbuff_remaining);
		rs = read(zip->temp_fd, wb, rsize);
		if (rs < 0) {
			archive_set_error(&(a->archive), errno,
			    "Can't read temporary file(%jd)",
			    (intmax_t)rs);
			return (ARCHIVE_FATAL);
		}
		if (rs == 0) {
			archive_set_error(&(a->archive), 0,
			    "Truncated 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		zip->wbuff_remaining -= rs;
		length -= rs;
		if (zip->wbuff_remaining == 0) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
	}
	return (ARCHIVE_OK);
}